

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O1

double chaiscript::boxed_cast<double>(Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  undefined8 *puVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 local_78 [56];
  undefined4 local_40;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_78._0_8_ = &double::typeinfo;
    local_78._8_8_ = &double::typeinfo;
    local_78._16_4_ = 0x10;
    bVar4 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_78);
    if (!bVar4) {
      bVar4 = Type_Conversions::convertable_type<double>((t_conversions->m_conversions)._M_data);
      if (bVar4) {
        if (t_conversions == (Type_Conversions_State *)0x0) {
LAB_002d1ec5:
          puVar5 = (undefined8 *)__cxa_allocate_exception(0x38);
          peVar1 = (bv->m_data).
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_78._16_4_ = (peVar1->m_type_info).m_flags;
          local_78._20_4_ = *(undefined4 *)&(peVar1->m_type_info).field_0x14;
          ptVar2 = (peVar1->m_type_info).m_type_info;
          ptVar3 = (peVar1->m_type_info).m_bare_type_info;
          *puVar5 = &PTR__bad_cast_003c7aa0;
          local_78._0_4_ = SUB84(ptVar2,0);
          local_78._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
          local_78._8_4_ = SUB84(ptVar3,0);
          local_78._12_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
          *(undefined4 *)(puVar5 + 1) = local_78._0_4_;
          *(undefined4 *)((long)puVar5 + 0xc) = local_78._4_4_;
          *(undefined4 *)(puVar5 + 2) = local_78._8_4_;
          *(undefined4 *)((long)puVar5 + 0x14) = local_78._12_4_;
          puVar5[3] = local_78._16_8_;
          puVar5[4] = &double::typeinfo;
          puVar5[5] = 0x19;
          puVar5[6] = "Cannot perform boxed_cast";
          local_78._0_8_ = ptVar2;
          local_78._8_8_ = ptVar3;
          __cxa_throw(puVar5,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        bVar4 = Type_Conversions::convertable_type<double>((t_conversions->m_conversions)._M_data);
        if (!bVar4) goto LAB_002d1ec5;
        local_78._40_8_ = &double::typeinfo;
        local_78._48_8_ = &double::typeinfo;
        local_40 = 0x10;
        Type_Conversions::boxed_type_conversion
                  ((Type_Conversions *)local_78,(Type_Info *)(t_conversions->m_conversions)._M_data,
                   (Conversion_Saves *)(local_78 + 0x28),
                   (Boxed_Value *)(t_conversions->m_saves)._M_data);
        puVar5 = (undefined8 *)
                 detail::verify_type<void>
                           ((Boxed_Value *)local_78,(type_info *)&double::typeinfo,
                            *(void **)(local_78._0_8_ + 0x28));
        local_78._32_8_ = *puVar5;
        uVar6 = (undefined4)local_78._32_8_;
        uVar7 = (undefined4)((ulong)local_78._32_8_ >> 0x20);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_78._8_8_);
          uVar6 = (undefined4)local_78._32_8_;
          uVar7 = SUB84(local_78._32_8_,4);
        }
        goto LAB_002d1eb9;
      }
    }
  }
  puVar5 = (undefined8 *)
           detail::verify_type<void>
                     (bv,(type_info *)&double::typeinfo,
                      ((bv->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_const_data_ptr);
  uVar6 = (undefined4)*puVar5;
  uVar7 = (undefined4)((ulong)*puVar5 >> 0x20);
LAB_002d1eb9:
  return (double)CONCAT44(uVar7,uVar6);
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }